

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Swish_x86_avx512::forward_inplace(Swish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 (*pauVar21) [64];
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar28 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar33 [32];
  
  iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  auVar34 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar35 = vxorps_avx512dq(auVar34,(undefined1  [64])::_ps512_cephes_exp_C1);
  auVar34 = vxorps_avx512dq(auVar34,(undefined1  [64])::_ps512_cephes_exp_C2);
  uVar24 = 0;
  uVar23 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar23 = uVar24;
  }
  for (; uVar24 != uVar23; uVar24 = uVar24 + 1) {
    pauVar21 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar24 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    for (iVar22 = 0; iVar22 + 0xf < iVar20; iVar22 = iVar22 + 0x10) {
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar36._16_4_ = 0x80000000;
      auVar36._20_4_ = 0x80000000;
      auVar36._24_4_ = 0x80000000;
      auVar36._28_4_ = 0x80000000;
      auVar36._32_4_ = 0x80000000;
      auVar36._36_4_ = 0x80000000;
      auVar36._40_4_ = 0x80000000;
      auVar36._44_4_ = 0x80000000;
      auVar36._48_4_ = 0x80000000;
      auVar36._52_4_ = 0x80000000;
      auVar36._56_4_ = 0x80000000;
      auVar36._60_4_ = 0x80000000;
      auVar36 = vxorps_avx512dq(*pauVar21,auVar36);
      auVar36 = vminps_avx512f(auVar36,(undefined1  [64])::_ps512_exp_hi);
      auVar36 = vmaxps_avx512f(auVar36,(undefined1  [64])::_ps512_exp_lo);
      auVar37 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar36,
                                    (undefined1  [64])::_ps512_cephes_exp_p5);
      auVar38 = vrndscaleps_avx512f(auVar37,1);
      uVar4 = vcmpps_avx512f(auVar37,auVar38,1);
      auVar37 = vsubps_avx512f(auVar38,(undefined1  [64])::_ps512_1);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar39._0_4_ = (uint)bVar3 * auVar37._0_4_ | (uint)!bVar3 * auVar38._0_4_;
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar3 * auVar37._4_4_ | (uint)!bVar3 * auVar38._4_4_;
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar3 * auVar37._8_4_ | (uint)!bVar3 * auVar38._8_4_;
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar3 * auVar37._12_4_ | (uint)!bVar3 * auVar38._12_4_;
      bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar3 * auVar37._16_4_ | (uint)!bVar3 * auVar38._16_4_;
      bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar3 * auVar37._20_4_ | (uint)!bVar3 * auVar38._20_4_;
      bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar3 * auVar37._24_4_ | (uint)!bVar3 * auVar38._24_4_;
      bVar3 = (bool)((byte)(uVar4 >> 7) & 1);
      auVar39._28_4_ = (uint)bVar3 * auVar37._28_4_ | (uint)!bVar3 * auVar38._28_4_;
      bVar3 = (bool)((byte)(uVar4 >> 8) & 1);
      auVar39._32_4_ = (uint)bVar3 * auVar37._32_4_ | (uint)!bVar3 * auVar38._32_4_;
      bVar3 = (bool)((byte)(uVar4 >> 9) & 1);
      auVar39._36_4_ = (uint)bVar3 * auVar37._36_4_ | (uint)!bVar3 * auVar38._36_4_;
      bVar3 = (bool)((byte)(uVar4 >> 10) & 1);
      auVar39._40_4_ = (uint)bVar3 * auVar37._40_4_ | (uint)!bVar3 * auVar38._40_4_;
      bVar3 = (bool)((byte)(uVar4 >> 0xb) & 1);
      auVar39._44_4_ = (uint)bVar3 * auVar37._44_4_ | (uint)!bVar3 * auVar38._44_4_;
      bVar3 = (bool)((byte)(uVar4 >> 0xc) & 1);
      auVar39._48_4_ = (uint)bVar3 * auVar37._48_4_ | (uint)!bVar3 * auVar38._48_4_;
      bVar3 = (bool)((byte)(uVar4 >> 0xd) & 1);
      auVar39._52_4_ = (uint)bVar3 * auVar37._52_4_ | (uint)!bVar3 * auVar38._52_4_;
      bVar3 = (bool)((byte)(uVar4 >> 0xe) & 1);
      auVar39._56_4_ = (uint)bVar3 * auVar37._56_4_ | (uint)!bVar3 * auVar38._56_4_;
      bVar3 = SUB81(uVar4 >> 0xf,0);
      auVar39._60_4_ = (uint)bVar3 * auVar37._60_4_ | (uint)!bVar3 * auVar38._60_4_;
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar39,auVar35);
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar39,auVar34);
      auVar37 = vmulps_avx512f(auVar36,auVar36);
      auVar38 = vfmadd132ps_avx512f(auVar36,(undefined1  [64])::_ps512_cephes_exp_p1,
                                    (undefined1  [64])::_ps512_cephes_exp_p0);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])::_ps512_cephes_exp_p2);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])::_ps512_cephes_exp_p3);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])::_ps512_cephes_exp_p4);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])::_ps512_cephes_exp_p5);
      auVar36 = vfmadd213ps_avx512f(auVar38,auVar37,auVar36);
      auVar36 = vaddps_avx512f(auVar36,(undefined1  [64])::_ps512_1);
      auVar37 = vcvttps2dq_avx512f(auVar39);
      auVar37 = vpaddd_avx512f(auVar37,(undefined1  [64])::_pi32_512_0x7f);
      auVar38 = vpslld_avx512f(auVar37,0x17);
      auVar37._8_4_ = 0x3f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      auVar37._12_4_ = 0x3f800000;
      auVar37._16_4_ = 0x3f800000;
      auVar37._20_4_ = 0x3f800000;
      auVar37._24_4_ = 0x3f800000;
      auVar37._28_4_ = 0x3f800000;
      auVar37._32_4_ = 0x3f800000;
      auVar37._36_4_ = 0x3f800000;
      auVar37._40_4_ = 0x3f800000;
      auVar37._44_4_ = 0x3f800000;
      auVar37._48_4_ = 0x3f800000;
      auVar37._52_4_ = 0x3f800000;
      auVar37._56_4_ = 0x3f800000;
      auVar37._60_4_ = 0x3f800000;
      auVar36 = vfmadd213ps_avx512f(auVar38,auVar36,auVar37);
      auVar36 = vdivps_avx512f(*pauVar21,auVar36);
      *pauVar21 = auVar36;
      pauVar21 = pauVar21 + 1;
    }
    for (; iVar22 + 7 < iVar20; iVar22 = iVar22 + 8) {
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar29 = vxorps_avx512vl(*(undefined1 (*) [32])*pauVar21,auVar29);
      auVar30._8_4_ = 0x42b0c0a5;
      auVar30._0_8_ = 0x42b0c0a542b0c0a5;
      auVar30._12_4_ = 0x42b0c0a5;
      auVar30._16_4_ = 0x42b0c0a5;
      auVar30._20_4_ = 0x42b0c0a5;
      auVar30._24_4_ = 0x42b0c0a5;
      auVar30._28_4_ = 0x42b0c0a5;
      auVar29 = vminps_avx512vl(auVar29,auVar30);
      auVar31._8_4_ = 0xc2b0c0a5;
      auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar31._12_4_ = 0xc2b0c0a5;
      auVar31._16_4_ = 0xc2b0c0a5;
      auVar31._20_4_ = 0xc2b0c0a5;
      auVar31._24_4_ = 0xc2b0c0a5;
      auVar31._28_4_ = 0xc2b0c0a5;
      auVar30 = vmaxps_avx512vl(auVar29,auVar31);
      auVar51._8_4_ = 0x3f000000;
      auVar51._0_8_ = 0x3f0000003f000000;
      auVar51._12_4_ = 0x3f000000;
      auVar51._16_4_ = 0x3f000000;
      auVar51._20_4_ = 0x3f000000;
      auVar51._24_4_ = 0x3f000000;
      auVar51._28_4_ = 0x3f000000;
      auVar32._8_4_ = 0x3fb8aa3b;
      auVar32._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar32._12_4_ = 0x3fb8aa3b;
      auVar32._16_4_ = 0x3fb8aa3b;
      auVar32._20_4_ = 0x3fb8aa3b;
      auVar32._24_4_ = 0x3fb8aa3b;
      auVar32._28_4_ = 0x3fb8aa3b;
      auVar31 = vfmadd231ps_avx512vl(auVar51,auVar30,auVar32);
      auVar29 = vroundps_avx(auVar31,1);
      uVar4 = vcmpps_avx512vl(auVar31,auVar29,1);
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = 0x3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      auVar53._16_4_ = 0x3f800000;
      auVar53._20_4_ = 0x3f800000;
      auVar53._24_4_ = 0x3f800000;
      auVar53._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx512vl(auVar29,auVar53);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar33._0_4_ = (float)((uint)bVar3 * auVar32._0_4_ | (uint)!bVar3 * auVar29._0_4_);
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar33._4_4_ = (float)((uint)bVar3 * auVar32._4_4_ | (uint)!bVar3 * auVar29._4_4_);
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar33._8_4_ = (float)((uint)bVar3 * auVar32._8_4_ | (uint)!bVar3 * auVar29._8_4_);
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar33._12_4_ = (float)((uint)bVar3 * auVar32._12_4_ | (uint)!bVar3 * auVar29._12_4_);
      bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar33._16_4_ = (float)((uint)bVar3 * auVar32._16_4_ | (uint)!bVar3 * auVar29._16_4_);
      bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar33._20_4_ = (float)((uint)bVar3 * auVar32._20_4_ | (uint)!bVar3 * auVar29._20_4_);
      bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar33._24_4_ = (float)((uint)bVar3 * auVar32._24_4_ | (uint)!bVar3 * auVar29._24_4_);
      bVar3 = SUB81(uVar4 >> 7,0);
      auVar33._28_4_ = (float)((uint)bVar3 * auVar32._28_4_ | (uint)!bVar3 * auVar29._28_4_);
      auVar12._8_4_ = 0x3f318000;
      auVar12._0_8_ = 0x3f3180003f318000;
      auVar12._12_4_ = 0x3f318000;
      auVar12._16_4_ = 0x3f318000;
      auVar12._20_4_ = 0x3f318000;
      auVar12._24_4_ = 0x3f318000;
      auVar12._28_4_ = 0x3f318000;
      auVar29 = vfmsub231ps_avx512vl(auVar30,auVar33,auVar12);
      auVar13._8_4_ = 0x395e8083;
      auVar13._0_8_ = 0x395e8083395e8083;
      auVar13._12_4_ = 0x395e8083;
      auVar13._16_4_ = 0x395e8083;
      auVar13._20_4_ = 0x395e8083;
      auVar13._24_4_ = 0x395e8083;
      auVar13._28_4_ = 0x395e8083;
      auVar29 = vfmsub231ps_avx512vl(auVar29,auVar33,auVar13);
      auVar19._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar19._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar19._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar19._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar19._16_4_ = auVar29._16_4_ * auVar29._16_4_;
      auVar19._20_4_ = auVar29._20_4_ * auVar29._20_4_;
      auVar19._24_4_ = auVar29._24_4_ * auVar29._24_4_;
      auVar19._28_4_ = auVar31._28_4_;
      auVar49._8_4_ = 0x39506967;
      auVar49._0_8_ = 0x3950696739506967;
      auVar49._12_4_ = 0x39506967;
      auVar49._16_4_ = 0x39506967;
      auVar49._20_4_ = 0x39506967;
      auVar49._24_4_ = 0x39506967;
      auVar49._28_4_ = 0x39506967;
      auVar14._8_4_ = 0x3ab743ce;
      auVar14._0_8_ = 0x3ab743ce3ab743ce;
      auVar14._12_4_ = 0x3ab743ce;
      auVar14._16_4_ = 0x3ab743ce;
      auVar14._20_4_ = 0x3ab743ce;
      auVar14._24_4_ = 0x3ab743ce;
      auVar14._28_4_ = 0x3ab743ce;
      auVar30 = vfmadd213ps_avx512vl(auVar49,auVar29,auVar14);
      auVar15._8_4_ = 0x3c088908;
      auVar15._0_8_ = 0x3c0889083c088908;
      auVar15._12_4_ = 0x3c088908;
      auVar15._16_4_ = 0x3c088908;
      auVar15._20_4_ = 0x3c088908;
      auVar15._24_4_ = 0x3c088908;
      auVar15._28_4_ = 0x3c088908;
      auVar30 = vfmadd213ps_avx512vl(auVar30,auVar29,auVar15);
      auVar16._8_4_ = 0x3d2aa9c1;
      auVar16._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar16._12_4_ = 0x3d2aa9c1;
      auVar16._16_4_ = 0x3d2aa9c1;
      auVar16._20_4_ = 0x3d2aa9c1;
      auVar16._24_4_ = 0x3d2aa9c1;
      auVar16._28_4_ = 0x3d2aa9c1;
      auVar30 = vfmadd213ps_avx512vl(auVar30,auVar29,auVar16);
      auVar17._8_4_ = 0x3e2aaaaa;
      auVar17._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar17._12_4_ = 0x3e2aaaaa;
      auVar17._16_4_ = 0x3e2aaaaa;
      auVar17._20_4_ = 0x3e2aaaaa;
      auVar17._24_4_ = 0x3e2aaaaa;
      auVar17._28_4_ = 0x3e2aaaaa;
      auVar30 = vfmadd213ps_avx512vl(auVar30,auVar29,auVar17);
      auVar2 = vfmadd213ps_fma(auVar30,auVar29,auVar51);
      auVar2 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar19,auVar29);
      auVar43._0_4_ = auVar2._0_4_ + 1.0;
      auVar43._4_4_ = auVar2._4_4_ + 1.0;
      auVar43._8_4_ = auVar2._8_4_ + 1.0;
      auVar43._12_4_ = auVar2._12_4_ + 1.0;
      auVar43._16_4_ = 0x3f800000;
      auVar43._20_4_ = 0x3f800000;
      auVar43._24_4_ = 0x3f800000;
      auVar43._28_4_ = 0x3f800000;
      auVar46._0_4_ = (int)auVar33._0_4_;
      auVar46._4_4_ = (int)auVar33._4_4_;
      auVar46._8_4_ = (int)auVar33._8_4_;
      auVar46._12_4_ = (int)auVar33._12_4_;
      auVar46._16_4_ = (int)auVar33._16_4_;
      auVar46._20_4_ = (int)auVar33._20_4_;
      auVar46._24_4_ = (int)auVar33._24_4_;
      auVar46._28_4_ = (int)auVar33._28_4_;
      auVar29 = vpslld_avx2(auVar46,0x17);
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar18._16_4_ = 0x3f800000;
      auVar18._20_4_ = 0x3f800000;
      auVar18._24_4_ = 0x3f800000;
      auVar18._28_4_ = 0x3f800000;
      auVar29 = vpaddd_avx512vl(auVar29,auVar18);
      auVar2 = vfmadd213ps_fma(auVar29,auVar43,auVar53);
      auVar29 = vdivps_avx(*(undefined1 (*) [32])*pauVar21,ZEXT1632(auVar2));
      *(undefined1 (*) [32])*pauVar21 = auVar29;
      pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
    }
    for (; iVar22 + 3 < iVar20; iVar22 = iVar22 + 4) {
      auVar2 = *(undefined1 (*) [16])*pauVar21;
      auVar41._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = auVar2._8_4_ ^ 0x80000000;
      auVar41._12_4_ = auVar2._12_4_ ^ 0x80000000;
      auVar25._8_4_ = 0x42b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar25._12_4_ = 0x42b0c0a5;
      auVar25 = vminps_avx512vl(auVar41,auVar25);
      auVar26._8_4_ = 0xc2b0c0a5;
      auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar26._12_4_ = 0xc2b0c0a5;
      auVar26 = vmaxps_avx512vl(auVar25,auVar26);
      auVar50._8_4_ = 0x3f000000;
      auVar50._0_8_ = 0x3f0000003f000000;
      auVar50._12_4_ = 0x3f000000;
      auVar27._8_4_ = 0x3fb8aa3b;
      auVar27._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar27._12_4_ = 0x3fb8aa3b;
      auVar27 = vfmadd231ps_avx512vl(auVar50,auVar26,auVar27);
      auVar47._0_4_ = (int)auVar27._0_4_;
      auVar47._4_4_ = (int)auVar27._4_4_;
      auVar47._8_4_ = (int)auVar27._8_4_;
      auVar47._12_4_ = (int)auVar27._12_4_;
      auVar25 = vcvtdq2ps_avx(auVar47);
      uVar4 = vcmpps_avx512vl(auVar27,auVar25,1);
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      auVar27 = vsubps_avx512vl(auVar25,auVar52);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar28._0_4_ = (float)((uint)bVar3 * auVar27._0_4_ | (uint)!bVar3 * auVar25._0_4_);
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar28._4_4_ = (float)((uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar25._4_4_);
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar28._8_4_ = (float)((uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar25._8_4_);
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar28._12_4_ = (float)((uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar25._12_4_);
      auVar5._8_4_ = 0x3f318000;
      auVar5._0_8_ = 0x3f3180003f318000;
      auVar5._12_4_ = 0x3f318000;
      auVar25 = vfmsub231ps_avx512vl(auVar26,auVar28,auVar5);
      auVar6._8_4_ = 0x395e8083;
      auVar6._0_8_ = 0x395e8083395e8083;
      auVar6._12_4_ = 0x395e8083;
      auVar26 = vfmsub231ps_avx512vl(auVar25,auVar28,auVar6);
      auVar44._0_4_ = auVar26._0_4_ * auVar26._0_4_;
      auVar44._4_4_ = auVar26._4_4_ * auVar26._4_4_;
      auVar44._8_4_ = auVar26._8_4_ * auVar26._8_4_;
      auVar44._12_4_ = auVar26._12_4_ * auVar26._12_4_;
      auVar48._8_4_ = 0x39506967;
      auVar48._0_8_ = 0x3950696739506967;
      auVar48._12_4_ = 0x39506967;
      auVar7._8_4_ = 0x3ab743ce;
      auVar7._0_8_ = 0x3ab743ce3ab743ce;
      auVar7._12_4_ = 0x3ab743ce;
      auVar25 = vfmadd213ps_avx512vl(auVar48,auVar26,auVar7);
      auVar8._8_4_ = 0x3c088908;
      auVar8._0_8_ = 0x3c0889083c088908;
      auVar8._12_4_ = 0x3c088908;
      auVar25 = vfmadd213ps_avx512vl(auVar25,auVar26,auVar8);
      auVar9._8_4_ = 0x3d2aa9c1;
      auVar9._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar9._12_4_ = 0x3d2aa9c1;
      auVar25 = vfmadd213ps_avx512vl(auVar25,auVar26,auVar9);
      auVar10._8_4_ = 0x3e2aaaaa;
      auVar10._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar10._12_4_ = 0x3e2aaaaa;
      auVar25 = vfmadd213ps_avx512vl(auVar25,auVar26,auVar10);
      auVar25 = vfmadd213ps_fma(auVar25,auVar26,auVar50);
      auVar25 = vfmadd213ps_fma(auVar25,auVar44,auVar26);
      auVar42._0_4_ = auVar25._0_4_ + 1.0;
      auVar42._4_4_ = auVar25._4_4_ + 1.0;
      auVar42._8_4_ = auVar25._8_4_ + 1.0;
      auVar42._12_4_ = auVar25._12_4_ + 1.0;
      auVar45._0_4_ = (int)auVar28._0_4_;
      auVar45._4_4_ = (int)auVar28._4_4_;
      auVar45._8_4_ = (int)auVar28._8_4_;
      auVar45._12_4_ = (int)auVar28._12_4_;
      auVar25 = vpslld_avx(auVar45,0x17);
      auVar11._8_4_ = 0x3f800000;
      auVar11._0_8_ = 0x3f8000003f800000;
      auVar11._12_4_ = 0x3f800000;
      auVar25 = vpaddd_avx512vl(auVar25,auVar11);
      auVar25 = vfmadd213ps_fma(auVar25,auVar42,auVar52);
      auVar2 = vdivps_avx(auVar2,auVar25);
      *(undefined1 (*) [16])*pauVar21 = auVar2;
      pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x10);
    }
    for (; iVar22 < iVar20; iVar22 = iVar22 + 1) {
      fVar1 = *(float *)*pauVar21;
      fVar40 = expf(-fVar1);
      *(float *)*pauVar21 = fVar1 / (fVar40 + 1.0);
      pauVar21 = (undefined1 (*) [64])(*pauVar21 + 4);
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}